

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::SimpleTypeHandler<2UL>::SimpleTypeHandler
          (SimpleTypeHandler<2UL> *this,long SharedFunctionPropertyDescriptors,byte param_3,
          uint16 param_4,uint16 param_5)

{
  undefined8 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  long lVar5;
  bool bVar6;
  
  DynamicTypeHandler::DynamicTypeHandler(&this->super_DynamicTypeHandler,2,param_4,param_5,'\x1d');
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01540cc0
  ;
  this->propertyCount = 2;
  this->descriptors[0].Id.ptr = (PropertyRecord *)0x0;
  this->descriptors[0].field_1.preventFalseReference = (Type)0x0;
  this->descriptors[0].field_1.Attributes = '\a';
  this->descriptors[1].Id.ptr = (PropertyRecord *)0x0;
  this->descriptors[1].field_1.preventFalseReference = (Type)0x0;
  this->descriptors[1].field_1.Attributes = '\a';
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  lVar5 = 0;
  bVar3 = true;
  do {
    bVar6 = bVar3;
    if ((*(byte *)(SharedFunctionPropertyDescriptors + 8 + lVar5 * 0x10) & 8) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                  ,0x42,
                                  "((SharedFunctionPropertyDescriptors[i].Attributes & 0x08) == 0)",
                                  "(SharedFunctionPropertyDescriptors[i].Attributes & PropertyDeleted) == 0"
                                 );
      if (!bVar3) goto LAB_00e452ac;
      *puVar4 = 0;
    }
    puVar1 = (undefined8 *)(SharedFunctionPropertyDescriptors + lVar5 * 0x10);
    this->descriptors[lVar5].Id.ptr = (PropertyRecord *)*puVar1;
    this->descriptors[lVar5].field_1.Attributes = *(Type *)(puVar1 + 1);
    lVar5 = 1;
    bVar3 = false;
  } while (bVar6);
  if ((param_3 & 0x60) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x47,
                                "((propertyTypes & ((0x80|0x10|0x20|0x40) & ~(0x10 | 0x80))) == 0)",
                                "(propertyTypes & (PropertyTypesAll & ~(PropertyTypesWritableDataOnly | PropertyTypesHasSpecialProperties))) == 0"
                               );
    if (!bVar3) {
LAB_00e452ac:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  DynamicTypeHandler::SetPropertyTypes(&this->super_DynamicTypeHandler,0x90,param_3);
  DynamicTypeHandler::SetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
  return;
}

Assistant:

SimpleTypeHandler<size>::SimpleTypeHandler(NO_WRITE_BARRIER_TAG_TYPE(SimplePropertyDescriptor const (&SharedFunctionPropertyDescriptors)[size]), PropertyTypes propertyTypes, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots) :
         DynamicTypeHandler(sizeof(descriptors) / sizeof(SimplePropertyDescriptor),
         inlineSlotCapacity, offsetOfInlineSlots, DefaultFlags | IsLockedFlag | MayBecomeSharedFlag | IsSharedFlag), propertyCount(size)
    {
        for (size_t i = 0; i < size; i++)
        {
            Assert((SharedFunctionPropertyDescriptors[i].Attributes & PropertyDeleted) == 0);
             // Used to init from global static BuiltInPropertyId
            NoWriteBarrierSet(descriptors[i].Id, SharedFunctionPropertyDescriptors[i].Id);
            descriptors[i].Attributes = SharedFunctionPropertyDescriptors[i].Attributes;
        }
        Assert((propertyTypes & (PropertyTypesAll & ~(PropertyTypesWritableDataOnly | PropertyTypesHasSpecialProperties))) == 0);
        SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesHasSpecialProperties, propertyTypes);
        SetIsInlineSlotCapacityLocked();
    }